

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fFboTestCase.cpp
# Opt level: O0

IterateResult __thiscall deqp::gles31::Functional::FboTestCase::iterate(FboTestCase *this)

{
  undefined8 log_00;
  int iVar1;
  deUint32 dVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  RenderContext *context_00;
  undefined4 extraout_var;
  char *pcVar7;
  MessageBuilder *pMVar8;
  Error *this_01;
  PixelFormat *pPVar9;
  Enum<int,_2UL> EVar10;
  undefined1 local_6878 [7];
  bool isOk;
  MultisamplePixelBufferAccess local_6850;
  MultisamplePixelBufferAccess local_6828;
  ReferenceContextLimits local_6800;
  undefined1 local_67a8 [8];
  ReferenceContext context_1;
  undefined1 local_5e8 [8];
  ReferenceContextBuffers buffers;
  FboIncompleteException *e;
  GetNameFunc local_3c8;
  int local_3c0;
  string local_3b8;
  deUint32 local_394;
  deUint32 err;
  undefined1 local_380 [8];
  GLContext context;
  undefined1 local_90 [8];
  Surface result;
  Surface reference;
  int y;
  int x;
  int height;
  undefined1 local_40 [4];
  int width;
  Random rnd;
  TestLog *log;
  RenderTarget *renderTarget;
  RenderContext *renderCtx;
  FboTestCase *this_local;
  RenderTarget *this_00;
  
  context_00 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*context_00->_vptr_RenderContext[4])();
  this_00 = (RenderTarget *)CONCAT44(extraout_var,iVar1);
  rnd.m_rnd._8_8_ =
       tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  pcVar7 = tcu::TestNode::getName((TestNode *)this);
  dVar2 = deStringHash(pcVar7);
  de::Random::Random((Random *)local_40,dVar2);
  iVar1 = tcu::RenderTarget::getWidth(this_00);
  iVar1 = ::deMin32(iVar1,this->m_viewportWidth);
  iVar3 = tcu::RenderTarget::getHeight(this_00);
  iVar3 = ::deMin32(iVar3,this->m_viewportHeight);
  iVar4 = tcu::RenderTarget::getWidth(this_00);
  iVar4 = de::Random::getInt((Random *)local_40,0,iVar4 - iVar1);
  iVar5 = tcu::RenderTarget::getHeight(this_00);
  iVar5 = de::Random::getInt((Random *)local_40,0,iVar5 - iVar3);
  tcu::Surface::Surface((Surface *)&result.m_pixels.m_cap);
  tcu::Surface::Surface((Surface *)local_90);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])();
  tcu::TestLog::operator<<
            ((MessageBuilder *)
             &context.m_programs.
              super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,(TestLog *)rnd.m_rnd._8_8_,
             (BeginMessageToken *)&tcu::TestLog::Message);
  pMVar8 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)
                      &context.m_programs.
                       super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (char (*) [25])"Rendering with GL driver");
  tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder
            ((MessageBuilder *)
             &context.m_programs.
              super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  log_00 = rnd.m_rnd._8_8_;
  tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&stack0xfffffffffffffc70,iVar4,iVar5,iVar1,iVar3);
  sglr::GLContext::GLContext
            ((GLContext *)local_380,context_00,(TestLog *)log_00,0,(IVec4 *)&stack0xfffffffffffffc70
            );
  sglr::ContextWrapper::setContext(&this->super_ContextWrapper,(Context *)local_380);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])(this,local_90);
  local_394 = sglr::ContextWrapper::glGetError(&this->super_ContextWrapper);
  if (local_394 != 0) {
    this_01 = (Error *)__cxa_allocate_exception(0x38);
    dVar2 = local_394;
    EVar10 = glu::getErrorStr(local_394);
    local_3c8 = EVar10.m_getName;
    local_3c0 = EVar10.m_value;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_3b8,&local_3c8);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    glu::Error::Error(this_01,dVar2,pcVar7,(char *)0x0,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fFboTestCase.cpp"
                      ,0x5c);
    __cxa_throw(this_01,&glu::Error::typeinfo,glu::Error::~Error);
  }
  sglr::ContextWrapper::setContext(&this->super_ContextWrapper,(Context *)0x0);
  sglr::GLContext::~GLContext((GLContext *)local_380);
  tcu::TestLog::operator<<
            ((MessageBuilder *)&buffers.m_stencilbuffer.m_data.m_cap,(TestLog *)rnd.m_rnd._8_8_,
             (BeginMessageToken *)&tcu::TestLog::Message);
  pMVar8 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)&buffers.m_stencilbuffer.m_data.m_cap,
                      (char (*) [26])"Rendering reference image");
  tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&buffers.m_stencilbuffer.m_data.m_cap);
  pPVar9 = tcu::RenderTarget::getPixelFormat(this_00);
  tcu::PixelFormat::PixelFormat
            ((PixelFormat *)
             &context_1.m_fragmentDepths.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,8,8,8,(uint)(pPVar9->alphaBits != 0) << 3);
  iVar4 = tcu::RenderTarget::getDepthBits(this_00);
  iVar5 = tcu::RenderTarget::getStencilBits(this_00);
  sglr::ReferenceContextBuffers::ReferenceContextBuffers
            ((ReferenceContextBuffers *)local_5e8,
             (PixelFormat *)
             &context_1.m_fragmentDepths.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,iVar4,iVar5,iVar1,iVar3,1);
  sglr::ReferenceContextLimits::ReferenceContextLimits(&local_6800,context_00);
  sglr::ReferenceContextBuffers::getColorbuffer(&local_6828,(ReferenceContextBuffers *)local_5e8);
  sglr::ReferenceContextBuffers::getDepthbuffer(&local_6850,(ReferenceContextBuffers *)local_5e8);
  sglr::ReferenceContextBuffers::getStencilbuffer
            ((MultisamplePixelBufferAccess *)local_6878,(ReferenceContextBuffers *)local_5e8);
  sglr::ReferenceContext::ReferenceContext
            ((ReferenceContext *)local_67a8,&local_6800,&local_6828,&local_6850,
             (MultisamplePixelBufferAccess *)local_6878);
  sglr::ReferenceContextLimits::~ReferenceContextLimits(&local_6800);
  sglr::ContextWrapper::setContext(&this->super_ContextWrapper,(Context *)local_67a8);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])
            (this,&result.m_pixels.m_cap);
  sglr::ContextWrapper::setContext(&this->super_ContextWrapper,(Context *)0x0);
  sglr::ReferenceContext::~ReferenceContext((ReferenceContext *)local_67a8);
  sglr::ReferenceContextBuffers::~ReferenceContextBuffers((ReferenceContextBuffers *)local_5e8);
  uVar6 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[7])
                    (this,&result.m_pixels.m_cap,local_90);
  pcVar7 = "Image comparison failed";
  if ((uVar6 & 1) != 0) {
    pcVar7 = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
             (byte)~((byte)uVar6 & 1) & QP_TEST_RESULT_FAIL,pcVar7);
  tcu::Surface::~Surface((Surface *)local_90);
  tcu::Surface::~Surface((Surface *)&result.m_pixels.m_cap);
  de::Random::~Random((Random *)local_40);
  return STOP;
}

Assistant:

FboTestCase::IterateResult FboTestCase::iterate (void)
{
	glu::RenderContext&			renderCtx		= TestCase::m_context.getRenderContext();
	const tcu::RenderTarget&	renderTarget	= renderCtx.getRenderTarget();
	TestLog&					log				= m_testCtx.getLog();

	// Viewport.
	de::Random					rnd				(deStringHash(getName()));
	int							width			= deMin32(renderTarget.getWidth(),	m_viewportWidth);
	int							height			= deMin32(renderTarget.getHeight(),	m_viewportHeight);
	int							x				= rnd.getInt(0, renderTarget.getWidth()		- width);
	int							y				= rnd.getInt(0, renderTarget.getHeight()	- height);

	// Surface format and storage is choosen by render().
	tcu::Surface				reference;
	tcu::Surface				result;

	// Call preCheck() that can throw exception if some requirement is not met.
	preCheck();

	log << TestLog::Message << "Rendering with GL driver" << TestLog::EndMessage;

	// Render using GLES3.1
	try
	{
		sglr::GLContext context(renderCtx, log, 0, tcu::IVec4(x, y, width, height));
		setContext(&context);
		render(result);

		// Check error.
		deUint32 err = glGetError();
		if (err != GL_NO_ERROR)
			throw glu::Error(err, glu::getErrorStr(err).toString().c_str(), DE_NULL, __FILE__, __LINE__);

		setContext(DE_NULL);
	}
	catch (const FboTestUtil::FboIncompleteException& e)
	{
		if (e.getReason() == GL_FRAMEBUFFER_UNSUPPORTED)
		{
			log << e;
			m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not supported");
			return STOP;
		}
		else
			throw;
	}

	log << TestLog::Message << "Rendering reference image" << TestLog::EndMessage;

	// Render reference.
	{
		sglr::ReferenceContextBuffers	buffers	(tcu::PixelFormat(8,8,8,renderTarget.getPixelFormat().alphaBits?8:0), renderTarget.getDepthBits(), renderTarget.getStencilBits(), width, height);
		sglr::ReferenceContext			context	(sglr::ReferenceContextLimits(renderCtx), buffers.getColorbuffer(), buffers.getDepthbuffer(), buffers.getStencilbuffer());

		setContext(&context);
		render(reference);
		setContext(DE_NULL);
	}

	bool isOk = compare(reference, result);
	m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
							isOk ? "Pass"				: "Image comparison failed");
	return STOP;
}